

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O2

void __thiscall xemmai::t_slot::t_queue<256UL>::f_next(t_queue<256UL> *this)

{
  t_engine *this_00;
  t_object **pptVar1;
  t_object **pptVar2;
  t_object **pptVar3;
  long in_FS_OFFSET;
  
  this_00 = *(t_engine **)(in_FS_OFFSET + -0x60);
  t_engine::f_tick(this_00);
  if (this->v_head < this->v_objects + 0xff) {
    pptVar1 = this->v_head + 1;
    this->v_head = pptVar1;
    while (pptVar2 = this->v_tail, pptVar2 == pptVar1) {
      t_engine::f_wait(this_00);
      pptVar1 = this->v_head;
    }
    pptVar3 = pptVar2 + -1;
    if (pptVar2 < pptVar1) {
      pptVar3 = this->v_objects + 0xff;
    }
  }
  else {
    pptVar1 = this->v_objects;
    this->v_head = pptVar1;
    while (this->v_tail == pptVar1) {
      t_engine::f_wait(this_00);
      pptVar1 = this->v_head;
    }
    pptVar3 = this->v_tail + -1;
  }
  pptVar2 = pptVar1 + 0x20;
  if (pptVar3 <= pptVar1 + 0x20) {
    pptVar2 = pptVar3;
  }
  this->v_next = pptVar2;
  return;
}

Assistant:

void t_slot::t_queue<A_SIZE>::f_next() noexcept
{
	auto engine = f_engine();
	engine->f_tick();
	if (v_head < v_objects + A_SIZE - 1) {
		++v_head;
		while (v_tail == v_head) engine->f_wait();
		auto tail = v_tail;
		v_next = std::min(tail < v_head ? v_objects + A_SIZE - 1 : tail - 1, v_head + A_SIZE / 8);
	} else {
		v_head = v_objects;
		while (v_tail == v_head) engine->f_wait();
		v_next = std::min(v_tail - 1, v_head + A_SIZE / 8);
	}
}